

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void correct_reed_solomon_decoder_create(correct_reed_solomon *rs)

{
  field_t field;
  field_t field_00;
  void *pvVar1;
  size_t *in_RDI;
  polynomial_t pVar2;
  field_operation_t i_1;
  uint i;
  field_logarithm_t *in_stack_ffffffffffffff18;
  size_t *psVar3;
  undefined8 in_stack_ffffffffffffff20;
  size_t *psVar4;
  undefined4 uStack_94;
  undefined4 uStack_84;
  ushort local_7e;
  uint local_7c;
  undefined4 uStack_6c;
  undefined4 uStack_5c;
  undefined4 uStack_4c;
  undefined4 uStack_3c;
  undefined4 uStack_2c;
  undefined4 uStack_1c;
  undefined4 uStack_c;
  
  *(undefined1 *)(in_RDI + 0x26) = 1;
  pvVar1 = calloc(in_RDI[2],1);
  in_RDI[0xe] = (size_t)pvVar1;
  pvVar1 = calloc(in_RDI[2] << 1,1);
  in_RDI[0xf] = (size_t)pvVar1;
  psVar3 = in_RDI;
  pVar2 = polynomial_create(0);
  psVar3[0x10] = (size_t)pVar2.coeff;
  psVar3[0x11] = CONCAT44(uStack_c,pVar2.order);
  psVar4 = in_RDI;
  pVar2 = polynomial_create(0);
  psVar4[0x12] = (size_t)pVar2.coeff;
  psVar4[0x13] = CONCAT44(uStack_1c,pVar2.order);
  pVar2 = polynomial_create(0);
  in_RDI[0x14] = (size_t)pVar2.coeff;
  in_RDI[0x15] = CONCAT44(uStack_2c,pVar2.order);
  pVar2 = polynomial_create(0);
  in_RDI[0x16] = (size_t)pVar2.coeff;
  in_RDI[0x17] = CONCAT44(uStack_3c,pVar2.order);
  pvVar1 = calloc(in_RDI[2] << 1,1);
  in_RDI[0x18] = (size_t)pvVar1;
  pvVar1 = malloc(in_RDI[2]);
  in_RDI[0x19] = (size_t)pvVar1;
  pvVar1 = malloc(in_RDI[2]);
  in_RDI[0x1a] = (size_t)pvVar1;
  pVar2 = polynomial_create(0);
  in_RDI[0x1c] = (size_t)pVar2.coeff;
  in_RDI[0x1d] = CONCAT44(uStack_4c,pVar2.order);
  pVar2 = polynomial_create(0);
  in_RDI[0x1e] = (size_t)pVar2.coeff;
  in_RDI[0x1f] = CONCAT44(uStack_5c,pVar2.order);
  pVar2 = polynomial_create(0);
  in_RDI[0x20] = (size_t)pVar2.coeff;
  in_RDI[0x21] = CONCAT44(uStack_6c,pVar2.order);
  pvVar1 = malloc(in_RDI[2] << 3);
  in_RDI[9] = (size_t)pvVar1;
  for (local_7c = 0; (ulong)local_7c < in_RDI[2]; local_7c = local_7c + 1) {
    pvVar1 = malloc(*in_RDI);
    *(void **)(in_RDI[9] + (ulong)local_7c * 8) = pvVar1;
    field.log = (field_logarithm_t *)psVar4;
    field.exp = (field_element_t *)psVar3;
    polynomial_build_exp_lut
              (field,(field_element_t)((ulong)in_stack_ffffffffffffff20 >> 0x38),
               (uint)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  pvVar1 = malloc(0x800);
  in_RDI[0x1b] = (size_t)pvVar1;
  for (local_7e = 0; local_7e < 0x100; local_7e = local_7e + 1) {
    pvVar1 = malloc(in_RDI[2]);
    *(void **)(in_RDI[0x1b] + (ulong)local_7e * 8) = pvVar1;
    field_00.log = (field_logarithm_t *)psVar4;
    field_00.exp = (field_element_t *)psVar3;
    polynomial_build_exp_lut
              (field_00,(field_element_t)((ulong)in_stack_ffffffffffffff20 >> 0x38),
               (uint)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  psVar3 = in_RDI;
  pVar2 = polynomial_create(0);
  psVar3[0x22] = (size_t)pVar2.coeff;
  psVar3[0x23] = CONCAT44(uStack_84,pVar2.order);
  pVar2 = polynomial_create(0);
  in_RDI[0x24] = (size_t)pVar2.coeff;
  in_RDI[0x25] = CONCAT44(uStack_94,pVar2.order);
  return;
}

Assistant:

void correct_reed_solomon_decoder_create(correct_reed_solomon *rs) {
    rs->has_init_decode = true;
    rs->syndromes = calloc(rs->min_distance, sizeof(field_element_t));
    rs->modified_syndromes = calloc(2 * rs->min_distance, sizeof(field_element_t));
    rs->received_polynomial = polynomial_create(rs->block_length - 1);
    rs->error_locator = polynomial_create(rs->min_distance);
    rs->error_locator_log = polynomial_create(rs->min_distance);
    rs->erasure_locator = polynomial_create(rs->min_distance);
    rs->error_roots = calloc(2 * rs->min_distance, sizeof(field_element_t));
    rs->error_vals = malloc(rs->min_distance * sizeof(field_element_t));
    rs->error_locations = malloc(rs->min_distance * sizeof(field_logarithm_t));

    rs->last_error_locator = polynomial_create(rs->min_distance);
    rs->error_evaluator = polynomial_create(rs->min_distance - 1);
    rs->error_locator_derivative = polynomial_create(rs->min_distance - 1);

    // calculate and store the first block_length powers of every generator root
    // we would have to do this work in order to calculate the syndromes
    // if we save it, we can prevent the need to recalculate it on subsequent calls
    // total memory usage is min_distance * block_length bytes e.g. 32 * 255 ~= 8k
    rs->generator_root_exp = malloc(rs->min_distance * sizeof(field_logarithm_t *));
    for (unsigned int i = 0; i < rs->min_distance; i++) {
        rs->generator_root_exp[i] = malloc(rs->block_length * sizeof(field_logarithm_t));
        polynomial_build_exp_lut(rs->field, rs->generator_roots[i], rs->block_length - 1, rs->generator_root_exp[i]);
    }

    // calculate and store the first min_distance powers of every element in the field
    // we would have to do this for chien search anyway, and its size is only 256 * min_distance bytes
    // for min_distance = 32 this is 8k of memory, a pittance for the speedup we receive in exchange
    // we also get to reuse this work during error value calculation
    rs->element_exp = malloc(256 * sizeof(field_logarithm_t *));
    for (field_operation_t i = 0; i < 256; i++) {
        rs->element_exp[i] = malloc(rs->min_distance * sizeof(field_logarithm_t));
        polynomial_build_exp_lut(rs->field, i, rs->min_distance - 1, rs->element_exp[i]);
    }

    rs->init_from_roots_scratch[0] = polynomial_create(rs->min_distance);
    rs->init_from_roots_scratch[1] = polynomial_create(rs->min_distance);
}